

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TextureLevel *
vkt::image::anon_unknown_0::generateReferenceImage
          (TextureLevel *__return_storage_ptr__,IVec3 *imageSize,VkFormat imageFormat,
          VkFormat readFormat)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  float s;
  TextureFormat local_130;
  PixelBufferAccess local_128;
  TextureFormat local_100;
  PixelBufferAccess local_f8;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vec4 local_b0;
  undefined1 local_a0 [8];
  IVec4 color;
  int x;
  int y;
  int z;
  int yMax;
  int xMax;
  undefined1 local_74 [3];
  bool intFormat;
  float storeColorBias;
  float local_68;
  float storeColorScale;
  undefined1 local_58 [8];
  PixelBufferAccess access;
  VkFormat readFormat_local;
  VkFormat imageFormat_local;
  IVec3 *imageSize_local;
  TextureLevel *reference;
  
  register0x00000000 = ::vk::mapVkFormat(imageFormat);
  iVar2 = tcu::Vector<int,_3>::x(imageSize);
  iVar3 = tcu::Vector<int,_3>::y(imageSize);
  iVar4 = tcu::Vector<int,_3>::z(imageSize);
  tcu::TextureLevel::TextureLevel
            (__return_storage_ptr__,
             (TextureFormat *)((long)&access.super_ConstPixelBufferAccess.m_data + 4),iVar2,iVar3,
             iVar4);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_58,__return_storage_ptr__);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_74,imageSize);
  local_68 = computeStoreColorScale(imageFormat,(IVec3 *)local_74);
  s = computeStoreColorBias(imageFormat);
  bVar1 = isIntegerFormat(imageFormat);
  iVar2 = tcu::Vector<int,_3>::x(imageSize);
  iVar3 = tcu::Vector<int,_3>::y(imageSize);
  for (x = 0; iVar4 = tcu::Vector<int,_3>::z(imageSize), x < iVar4; x = x + 1) {
    for (color.m_data[3] = 0; iVar4 = color.m_data[3], iVar5 = tcu::Vector<int,_3>::y(imageSize),
        iVar4 < iVar5; color.m_data[3] = color.m_data[3] + 1) {
      for (color.m_data[2] = 0; iVar4 = color.m_data[2], iVar5 = tcu::Vector<int,_3>::x(imageSize),
          iVar4 < iVar5; color.m_data[2] = color.m_data[2] + 1) {
        uVar8 = (iVar2 + -1) - color.m_data[2];
        uVar7 = (iVar3 + -1) - color.m_data[3];
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)local_a0,color.m_data[2] ^ color.m_data[3] ^ x,
                   uVar8 ^ color.m_data[3] ^ x,color.m_data[2] ^ uVar7 ^ x,uVar8 ^ uVar7 ^ x);
        if (bVar1) {
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_58,(IVec4 *)local_a0,color.m_data[2],color.m_data[3]
                     ,x);
        }
        else {
          tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_d0);
          tcu::operator*((tcu *)&local_c0,&local_d0,local_68);
          tcu::operator+((tcu *)&local_b0,&local_c0,s);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_58,&local_b0,color.m_data[2],color.m_data[3],x);
        }
      }
    }
  }
  bVar1 = ::vk::isFloatFormat(readFormat);
  if ((bVar1) && (imageFormat != readFormat)) {
    local_100 = ::vk::mapVkFormat(readFormat);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_58);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_f8,&local_100,imageSize,pvVar6);
    replaceBadFloatReinterpretValues(&local_f8);
  }
  bVar1 = ::vk::isSnormFormat(readFormat);
  if ((bVar1) && (imageFormat != readFormat)) {
    local_130 = ::vk::mapVkFormat(readFormat);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_58);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_128,&local_130,imageSize,pvVar6);
    replaceSnormReinterpretValues(&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TextureLevel generateReferenceImage (const tcu::IVec3& imageSize, const VkFormat imageFormat, const VkFormat readFormat)
{
	// Generate a reference image data using the storage format

	tcu::TextureLevel reference(mapVkFormat(imageFormat), imageSize.x(), imageSize.y(), imageSize.z());
	const tcu::PixelBufferAccess access = reference.getAccess();

	const float storeColorScale = computeStoreColorScale(imageFormat, imageSize);
	const float storeColorBias = computeStoreColorBias(imageFormat);

	const bool intFormat = isIntegerFormat(imageFormat);
	const int xMax = imageSize.x() - 1;
	const int yMax = imageSize.y() - 1;

	for (int z = 0; z < imageSize.z(); ++z)
	for (int y = 0; y < imageSize.y(); ++y)
	for (int x = 0; x < imageSize.x(); ++x)
	{
		const tcu::IVec4 color(x^y^z, (xMax - x)^y^z, x^(yMax - y)^z, (xMax - x)^(yMax - y)^z);

		if (intFormat)
			access.setPixel(color, x, y, z);
		else
			access.setPixel(color.asFloat()*storeColorScale + storeColorBias, x, y, z);
	}

	// If the image is to be accessed as a float texture, get rid of invalid values

	if (isFloatFormat(readFormat) && imageFormat != readFormat)
		replaceBadFloatReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));
	if (isSnormFormat(readFormat) && imageFormat != readFormat)
		replaceSnormReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));

	return reference;
}